

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O0

void rspectprod(float *data1,float *data2,float *outdata,long N)

{
  long in_RCX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  
  if (in_RCX < 2) {
    *in_RDX = *in_RDI * *in_RSI;
  }
  else {
    *in_RDX = *in_RDI * *in_RSI;
    in_RDX[1] = in_RDI[1] * in_RSI[1];
    cvprod(in_RDI + 2,in_RSI + 2,in_RDX + 2,in_RCX / 2 + -1);
  }
  return;
}

Assistant:

void rspectprod(float *data1, float *data2, float *outdata, long N){
// When multiplying a pair of spectra from rfft care must be taken to multiply the
// two real values seperately from the complex ones. This routine does it correctly.
// the result can be stored in-place over one of the inputs
/* INPUTS */
/* *data1 = input data array	first spectra */
/* *data2 = input data array	second spectra */
/* N = fft input size for both data1 and data2 */
/* OUTPUTS */
/* *outdata = output data array spectra */
if(N>1){
	outdata[0] = data1[0] * data2[0];	// multiply the zero freq values
	outdata[1] = data1[1] * data2[1];	// multiply the nyquest freq values
	cvprod(data1 + 2, data2 + 2, outdata + 2, N/2-1);	// multiply the other positive freq values
}
else{
	outdata[0] = data1[0] * data2[0];
}
}